

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsc.c
# Opt level: O2

int Dsc_CountAnds_rec(char *pStr,char **p,int *pMatches)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  pbVar3 = (byte *)*p;
  if (*pbVar3 != 0x21) goto LAB_00444d70;
  do {
    pbVar3 = pbVar3 + 1;
    *p = (char *)pbVar3;
LAB_00444d70:
    bVar4 = *pbVar3;
  } while ((byte)(bVar4 - 0x30) < 10 || (byte)(bVar4 + 0xbf) < 6);
  if (bVar4 == 0x3c) {
    bVar4 = 0x3c;
    if (pStr[(long)pMatches[(long)pbVar3 - (long)pStr] + 1] == '{') {
      pbVar3 = (byte *)(pStr + (long)pMatches[(long)pbVar3 - (long)pStr] + 1);
      *p = (char *)pbVar3;
      bVar4 = *pbVar3;
      goto LAB_00444db4;
    }
LAB_00444e31:
    iVar1 = pMatches[(long)pbVar3 - (long)pStr];
    if (bVar4 + 2 != (int)pStr[iVar1]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,500,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
    iVar6 = 3;
    while( true ) {
      pbVar3 = pbVar3 + 1;
      *p = (char *)pbVar3;
      if (pStr + iVar1 <= pbVar3) break;
      iVar7 = Dsc_CountAnds_rec(pStr,p,pMatches);
      iVar6 = iVar6 + iVar7;
      pbVar3 = (byte *)*p;
    }
    if (pbVar3 != (byte *)(pStr + iVar1)) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,0x1f7,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
  }
  else {
LAB_00444db4:
    if ((byte)(bVar4 + 0x9f) < 0x1a) {
      return 0;
    }
    uVar5 = (uint)bVar4;
    if (bVar4 != 0x28) {
      if ((uVar5 == 0x3c) || (uVar5 == 0x7b)) goto LAB_00444e31;
      if (uVar5 != 0x5b) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                      ,0x1fa,"int Dsc_CountAnds_rec(char *, char **, int *)");
      }
    }
    iVar1 = pMatches[(long)pbVar3 - (long)pStr];
    if (uVar5 + (bVar4 != 0x28) + 1 != (int)pStr[iVar1]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,0x1ea,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
    iVar7 = (uint)(bVar4 != 0x28) * 2 + 1;
    iVar6 = 0;
    while( true ) {
      pbVar3 = pbVar3 + 1;
      *p = (char *)pbVar3;
      if (pStr + iVar1 <= pbVar3) break;
      iVar2 = Dsc_CountAnds_rec(pStr,p,pMatches);
      iVar6 = iVar6 + iVar7 + iVar2;
      pbVar3 = (byte *)*p;
    }
    if (pbVar3 != (byte *)(pStr + iVar1)) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dsc/dsc.c"
                    ,0x1ed,"int Dsc_CountAnds_rec(char *, char **, int *)");
    }
    iVar6 = iVar6 - iVar7;
  }
  return iVar6;
}

Assistant:

int Dsc_CountAnds_rec( char * pStr, char ** p, int * pMatches )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return 0;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        int Counter = 0, AddOn = (**p == '(')? 1 : 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += AddOn + Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter - AddOn;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        int Counter = 3;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            Counter += Dsc_CountAnds_rec( pStr, p, pMatches );
        assert( *p == q );
        return Counter;
    }
    assert( 0 );
    return 0;
}